

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser-internal.h
# Opt level: O0

void __thiscall
wasm::WATParser::WithPosition<wasm::WATParser::ParseTypeDefsCtx>::~WithPosition
          (WithPosition<wasm::WATParser::ParseTypeDefsCtx> *this)

{
  WithPosition<wasm::WATParser::ParseTypeDefsCtx> *this_local;
  
  Lexer::setPos(&this->ctx->in,(ulong)this->original);
  Lexer::setAnnotations(&this->ctx->in,&this->annotations);
  std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::~vector
            (&this->annotations);
  return;
}

Assistant:

~WithPosition() {
    ctx.in.setPos(original);
    ctx.in.setAnnotations(std::move(annotations));
  }